

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O2

Field<Fixpp::TagT<372U,_Fixpp::Type::String>_> * __thiscall
Fixpp::Field<Fixpp::TagT<372U,_Fixpp::Type::String>_>::operator=
          (Field<Fixpp::TagT<372U,_Fixpp::Type::String>_> *this,
          Field<Fixpp::TagT<372U,_Fixpp::Type::String>_> *other)

{
  bool *pbVar1;
  
  if (other->empty_ == false) {
    pbVar1 = &other->empty_;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->val_,&other->val_);
    this->empty_ = false;
  }
  else {
    pbVar1 = &this->empty_;
  }
  *pbVar1 = true;
  return this;
}

Assistant:

Field& operator=(Field&& other)
        {
            if (!other.empty())
            {
                val_ = std::move(other.val_);
                empty_ = false;
                other.empty_ = true;
            }
            else
            {
                empty_ = true;
            }
            return *this;
        }